

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::parseWb(MipsParser *this,Parser *parser)

{
  int iVar1;
  Token *pTVar2;
  
  pTVar2 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar2->type == Identifier) {
    if (*(__index_type *)
         ((long)&(pTVar2->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    if (*(long *)((long)&(pTVar2->value).
                         super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                 + 8) == 2) {
      iVar1 = bcmp(*(void **)&(pTVar2->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              ._M_u,"wb",2);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

bool MipsParser::parseWb(Parser& parser)
{
	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	return token.identifierValue() == "wb";
}